

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

bool __thiscall Omega_h::InputScalar::as(InputScalar *this,bool *out)

{
  bool bVar1;
  bool *out_local;
  InputScalar *this_local;
  
  bVar1 = std::operator==(&this->str,"true");
  if (bVar1) {
    *out = true;
    this_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(&this->str,"false");
    if (bVar1) {
      *out = false;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool InputScalar::as(bool& out) const {
  if (str == "true") {
    out = true;
    return true;
  }
  if (str == "false") {
    out = false;
    return true;
  }
  return false;
}